

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnscapPlugIn.cpp
# Opt level: O1

int libithicap_close(my_bpftimeval ts)

{
  DnsStats *this;
  bool bVar1;
  int iVar2;
  CaptureSummary cs;
  CaptureSummary CStack_28;
  
  CaptureSummary::CaptureSummary(&CStack_28);
  this = libithicap_stats;
  if ((libithicap_stats != (DnsStats *)0x0) && (libithicap_stats->is_capture_stopped == false)) {
    libithicap_stats->is_capture_stopped = true;
    bVar1 = DnsStats::ExportToCaptureSummary(this,&CStack_28);
    if (bVar1) {
      bVar1 = CaptureSummary::Save(&CStack_28,libithicap_out_file);
      iVar2 = 0;
      if (bVar1) goto LAB_00168543;
      if (logerr != (logerr_t *)0x0) {
        (*logerr)("libithicap cannot save the capture summary on <%s>.\n",libithicap_out_file);
        iVar2 = -1;
        goto LAB_00168543;
      }
    }
    else if (logerr != (logerr_t *)0x0) {
      (*logerr)("libithicap cannot process the capture summary.\n");
      iVar2 = -1;
      goto LAB_00168543;
    }
  }
  iVar2 = -1;
LAB_00168543:
  CaptureSummary::~CaptureSummary(&CStack_28);
  return iVar2;
}

Assistant:

int libithicap_close(my_bpftimeval ts)
    {
        int exit_code = 0;
        CaptureSummary cs;

        UNREFERENCED_PARAMETER(ts);

        if (libithicap_stats == NULL ||
            libithicap_stats->IsCaptureStopped()) {
            exit_code = -1;
        } else {
            libithicap_stats->StopCapture();

            if (!libithicap_stats->ExportToCaptureSummary(&cs))
            {

                if (logerr != NULL)
                {
                    logerr("libithicap cannot process the capture summary.\n");
                }
                exit_code = -1;

            }
            else if (!cs.Save(libithicap_out_file))
            {
                if (logerr != NULL)
                {
                    logerr("libithicap cannot save the capture summary on <%s>.\n",
                        libithicap_out_file);
                }
                exit_code = -1;
            }
        }
        return exit_code;
    }